

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fPrimitiveBoundingBoxTests.cpp
# Opt level: O2

IterationConfig * __thiscall
deqp::gles31::Functional::anon_unknown_1::PointRenderCase::generateConfig
          (IterationConfig *__return_storage_ptr__,PointRenderCase *this,int iteration,
          IVec2 *renderTargetSize)

{
  Vec2 patternScale;
  Vector<float,_2> local_30;
  Vector<float,_4> local_28;
  
  BBoxRenderCase::generateRandomConfig
            (__return_storage_ptr__,&this->super_BBoxRenderCase,iteration * 0xdedede,
             renderTargetSize);
  if ((this->super_BBoxRenderCase).m_bboxSize < BBOXSIZE_SMALLER) {
    tcu::Vector<float,_2>::Vector(&local_30,&__return_storage_ptr__->patternSize);
    if ((this->super_BBoxRenderCase).m_hasTessellationStage == true) {
      local_28.m_data[0] = local_30.m_data[0] * 0.07;
      local_28.m_data[1] = local_30.m_data[1] * 0.07;
      local_28.m_data[2] = 0.0;
      local_28.m_data[3] = 0.0;
      tcu::Vector<float,_4>::operator-=(&(__return_storage_ptr__->bbox).min,&local_28);
      local_28.m_data[0] = local_30.m_data[0] * 0.07;
      local_28.m_data[1] = local_30.m_data[1] * 0.07;
      local_28.m_data[2] = 0.0;
      local_28.m_data[3] = 0.0;
      tcu::Vector<float,_4>::operator+=(&(__return_storage_ptr__->bbox).max,&local_28);
    }
    if ((this->super_BBoxRenderCase).m_hasGeometryStage == true) {
      local_28.m_data[0] = local_30.m_data[0] * 0.05;
      local_28.m_data[1] = local_30.m_data[1] * 0.02;
      local_28.m_data[2] = 0.0;
      local_28.m_data[3] = 0.0;
      tcu::Vector<float,_4>::operator-=(&(__return_storage_ptr__->bbox).min,&local_28);
      local_28.m_data[0] = local_30.m_data[0] * 0.05;
      local_28.m_data[1] = local_30.m_data[1] * 0.03;
      local_28.m_data[2] = 0.0;
      local_28.m_data[3] = 0.0;
      tcu::Vector<float,_4>::operator+=(&(__return_storage_ptr__->bbox).max,&local_28);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

PointRenderCase::IterationConfig PointRenderCase::generateConfig (int iteration, const tcu::IVec2& renderTargetSize) const
{
	IterationConfig config = generateRandomConfig(0xDEDEDEu * (deUint32)iteration, renderTargetSize);

	// equal or larger -> expand according to shader expansion
	if (m_bboxSize == BBOXSIZE_EQUAL || m_bboxSize == BBOXSIZE_LARGER)
	{
		const tcu::Vec2 patternScale = config.patternSize;

		if (m_hasTessellationStage)
		{
			config.bbox.min -= tcu::Vec4(0.07f * patternScale.x(), 0.07f * patternScale.y(), 0.0f, 0.0f);
			config.bbox.max += tcu::Vec4(0.07f * patternScale.x(), 0.07f * patternScale.y(), 0.0f, 0.0f);
		}
		if (m_hasGeometryStage)
		{
			config.bbox.min -= tcu::Vec4(0.05f * patternScale.x(), 0.02f * patternScale.y(), 0.0f, 0.0f);
			config.bbox.max += tcu::Vec4(0.05f * patternScale.x(), 0.03f * patternScale.y(), 0.0f, 0.0f);
		}
	}

	return config;
}